

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propd.c
# Opt level: O0

uchar property_set(char *key,char *value)

{
  uchar uVar1;
  int iVar2;
  char *in_RSI;
  int *in_RDI;
  char *in_stack_00001008;
  char *in_stack_00001010;
  
  if ((persistent_properties_loaded == 0) ||
     (iVar2 = strncmp("persist.",(char *)in_RDI,8), iVar2 != 0)) {
    if (*in_RDI == 0x2e6c7463) {
      handle_control_message((char *)in_RDI,in_RSI);
      return '\x01';
    }
  }
  else {
    write_peristent_property(in_stack_00001010,in_stack_00001008);
  }
  uVar1 = set_property(key,value);
  return uVar1;
}

Assistant:

unsigned char property_set(const char *key, const char *value)
{
    if (persistent_properties_loaded &&
            strncmp("persist.", key, strlen("persist.")) == 0) {
        /* 
         * Don't write properties to disk until after we have read all default properties
         * to prevent them from being overwritten by default values.
         */
        write_peristent_property(key, value);
    } else if(memcmp(key,"ctl.",4) == 0) {
        handle_control_message(key+4, key + PROPERTY_KEY_MAX);
		return (1);
	} 
	
	return set_property(key, value);
}